

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void __thiscall leveldb::DBImpl::MaybeScheduleCompaction(DBImpl *this)

{
  long lVar1;
  Version *pVVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->background_compaction_scheduled_ != false) ||
       (((this->shutting_down_)._M_base._M_i & 1U) != 0)) ||
      ((this->bg_error_).state_ != (char *)0x0)) ||
     (((this->manual_compaction_ == (ManualCompaction *)0x0 && this->imm_ == (MemTable *)0x0 &&
       (pVVar2 = this->versions_->current_, pVVar2->compaction_score_ < 1.0)) &&
      (pVVar2->file_to_compact_ == (FileMetaData *)0x0)))) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    this->background_compaction_scheduled_ = true;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      (*this->env_->_vptr_Env[0xf])(this->env_,BGWork,this,lVar1);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void DBImpl::MaybeScheduleCompaction() {
  mutex_.AssertHeld();
  if (background_compaction_scheduled_) {
    // Already scheduled
  } else if (shutting_down_.load(std::memory_order_acquire)) {
    // DB is being deleted; no more background compactions
  } else if (!bg_error_.ok()) {
    // Already got an error; no more changes
  } else if (imm_ == nullptr && manual_compaction_ == nullptr &&
             !versions_->NeedsCompaction()) {
    // No work to be done
  } else {
    background_compaction_scheduled_ = true;
    env_->Schedule(&DBImpl::BGWork, this);
  }
}